

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QWindowSystemInterface::TouchPoint>::Inserter::insertOne
          (Inserter *this,qsizetype pos,TouchPoint *t)

{
  qsizetype qVar1;
  TouchPoint *pTVar2;
  Data *pDVar3;
  QPointF *pQVar4;
  undefined4 uVar5;
  long lVar6;
  long lVar7;
  TouchPoint *pTVar8;
  undefined8 *puVar9;
  TouchPoint *pTVar10;
  TouchPoint *pTVar11;
  undefined8 *puVar12;
  long lVar13;
  byte bVar14;
  
  bVar14 = 0;
  pTVar10 = this->begin;
  lVar13 = this->size;
  pTVar2 = pTVar10 + lVar13;
  this->end = pTVar2;
  this->last = pTVar10 + lVar13 + -1;
  this->where = pTVar10 + pos;
  lVar6 = lVar13 - pos;
  this->sourceCopyConstruct = 0;
  this->nSource = 1;
  this->move = 1 - lVar6;
  this->sourceCopyAssign = 1;
  if (0 < lVar6) {
    pTVar8 = pTVar10 + lVar13 + -1;
    pTVar11 = pTVar2;
    for (lVar6 = 0xb; lVar6 != 0; lVar6 = lVar6 + -1) {
      uVar5 = *(undefined4 *)&pTVar8->field_0x4;
      pTVar11->id = pTVar8->id;
      *(undefined4 *)&pTVar11->field_0x4 = uVar5;
      pTVar8 = (TouchPoint *)&pTVar8->uniqueId;
      pTVar11 = (TouchPoint *)&pTVar11->uniqueId;
    }
    (pTVar2->velocity).v[1] = pTVar10[lVar13 + -1].velocity.v[1];
    pDVar3 = pTVar2[-1].rawPositions.d.d;
    pQVar4 = pTVar2[-1].rawPositions.d.ptr;
    pTVar2[-1].rawPositions.d.d = (Data *)0x0;
    pTVar2[-1].rawPositions.d.ptr = (QPointF *)0x0;
    (pTVar2->rawPositions).d.d = pDVar3;
    (pTVar2->rawPositions).d.ptr = pQVar4;
    qVar1 = pTVar2[-1].rawPositions.d.size;
    pTVar2[-1].rawPositions.d.size = 0;
    (pTVar2->rawPositions).d.size = qVar1;
    this->size = this->size + 1;
    if (this->move != 0) {
      lVar6 = 0x60;
      lVar13 = 0;
      do {
        pTVar2 = this->last;
        puVar9 = (undefined8 *)((long)pTVar2 + lVar6 + -0xd8);
        *(undefined4 *)((long)(pTVar2->velocity).v + lVar6 + -0x5c) = *(undefined4 *)(puVar9 + 0xb);
        puVar12 = (undefined8 *)((long)pTVar2 + lVar6 + -0x60);
        for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
          *puVar12 = *puVar9;
          puVar9 = puVar9 + (ulong)bVar14 * -2 + 1;
          puVar12 = puVar12 + (ulong)bVar14 * -2 + 1;
        }
        QArrayDataPointer<QPointF>::operator=
                  ((QArrayDataPointer<QPointF> *)((long)(pTVar2->velocity).v + lVar6 + -0x54),
                   (QArrayDataPointer<QPointF> *)((long)pTVar2[-1].velocity.v + lVar6 + -0x54));
        lVar13 = lVar13 + -1;
        lVar6 = lVar6 + -0x78;
      } while (lVar13 != this->move);
    }
    pTVar2 = this->where;
    pTVar10 = t;
    pTVar8 = pTVar2;
    for (lVar13 = 0xb; lVar13 != 0; lVar13 = lVar13 + -1) {
      uVar5 = *(undefined4 *)&pTVar10->field_0x4;
      pTVar8->id = pTVar10->id;
      *(undefined4 *)&pTVar8->field_0x4 = uVar5;
      pTVar10 = (TouchPoint *)((long)pTVar10 + (ulong)bVar14 * -0x10 + 8);
      pTVar8 = (TouchPoint *)((long)pTVar8 + (ulong)bVar14 * -0x10 + 8);
    }
    (pTVar2->velocity).v[1] = (t->velocity).v[1];
    QArrayDataPointer<QPointF>::operator=(&(pTVar2->rawPositions).d,&(t->rawPositions).d);
    return;
  }
  this->sourceCopyConstruct = 1 - lVar6;
  this->move = 0;
  this->sourceCopyAssign = lVar6;
  pTVar10 = t;
  pTVar8 = pTVar2;
  for (lVar13 = 0xb; lVar13 != 0; lVar13 = lVar13 + -1) {
    uVar5 = *(undefined4 *)&pTVar10->field_0x4;
    pTVar8->id = pTVar10->id;
    *(undefined4 *)&pTVar8->field_0x4 = uVar5;
    pTVar10 = (TouchPoint *)&pTVar10->uniqueId;
    pTVar8 = (TouchPoint *)&pTVar8->uniqueId;
  }
  (pTVar2->velocity).v[1] = (t->velocity).v[1];
  pDVar3 = (t->rawPositions).d.d;
  (t->rawPositions).d.d = (Data *)0x0;
  (pTVar2->rawPositions).d.d = pDVar3;
  pQVar4 = (t->rawPositions).d.ptr;
  (t->rawPositions).d.ptr = (QPointF *)0x0;
  (pTVar2->rawPositions).d.ptr = pQVar4;
  qVar1 = (t->rawPositions).d.size;
  (t->rawPositions).d.size = 0;
  (pTVar2->rawPositions).d.size = qVar1;
  this->size = this->size + 1;
  return;
}

Assistant:

void insertOne(qsizetype pos, T &&t)
        {
            setup(pos, 1);

            if (sourceCopyConstruct) {
                Q_ASSERT(sourceCopyConstruct == 1);
                new (end) T(std::move(t));
                ++size;
            } else {
                // create a new element at the end by move constructing one existing element
                // inside the array.
                new (end) T(std::move(*(end - 1)));
                ++size;

                // now move assign existing elements towards the end
                for (qsizetype i = 0; i != move; --i)
                    last[i] = std::move(last[i - 1]);

                // and move the new item into place
                *where = std::move(t);
            }
        }